

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exp_number.hpp
# Opt level: O2

void __thiscall
standards::exp_number<double>::exp_number(exp_number<double> *this,value_type_conflict3 v)

{
  value_type_conflict3 vVar1;
  
  if (v <= 0.0) {
    if (0.0 <= v) {
      this->sign_ = 0;
      vVar1 = 0.0;
      goto LAB_0010decc;
    }
    this->sign_ = -1;
    v = -v;
  }
  else {
    this->sign_ = 1;
  }
  vVar1 = log(v);
LAB_0010decc:
  this->log_ = vVar1;
  return;
}

Assistant:

exp_number(value_type v) {
    if (v > 0) {
      sign_ = is_positive;
      log_ = std::log(v);
    } else if (v < 0) {
      sign_ = is_negative;
      log_ = std::log(-v);
    } else {
      sign_ = is_zero;
      log_ = 0;
    }
  }